

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QRenderRule::QRenderRule(QRenderRule *this,QRenderRule *param_2)

{
  QSharedDataPointer<QStyleSheetOutlineData> *in_RSI;
  QSharedDataPointer<QStyleSheetOutlineData> *in_RDI;
  
  *(undefined4 *)&(in_RDI->d).ptr = *(undefined4 *)&(in_RSI->d).ptr;
  QBrush::QBrush((QBrush *)(in_RDI + 1),(QBrush *)(in_RSI + 1));
  QFont::QFont((QFont *)(in_RDI + 2),(QFont *)(in_RSI + 2));
  *(byte *)&in_RDI[4].d.ptr = *(byte *)&in_RSI[4].d.ptr & 1;
  QHash<QString,_QVariant>::QHash
            ((QHash<QString,_QVariant> *)in_RSI,(QHash<QString,_QVariant> *)in_RDI);
  QSharedDataPointer<QStyleSheetPaletteData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetPaletteData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetPaletteData> *)in_RDI);
  QSharedDataPointer<QStyleSheetBoxData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBoxData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetBoxData> *)in_RDI);
  QSharedDataPointer<QStyleSheetBackgroundData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBackgroundData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetBackgroundData> *)in_RDI);
  QSharedDataPointer<QStyleSheetBorderData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBorderData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetBorderData> *)in_RDI);
  QSharedDataPointer<QStyleSheetOutlineData>::QSharedDataPointer(in_RSI,in_RDI);
  QSharedDataPointer<QStyleSheetGeometryData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetGeometryData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetGeometryData> *)in_RDI);
  QSharedDataPointer<QStyleSheetPositionData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetPositionData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetPositionData> *)in_RDI);
  QSharedDataPointer<QStyleSheetImageData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetImageData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetImageData> *)in_RDI);
  QSharedDataPointer<QStyleSheetImageData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetImageData> *)in_RSI,
             (QSharedDataPointer<QStyleSheetImageData> *)in_RDI);
  *(undefined4 *)&in_RDI[0xf].d.ptr = *(undefined4 *)&in_RSI[0xf].d.ptr;
  QPainterPath::QPainterPath((QPainterPath *)(in_RDI + 0x10),(QPainterPath *)(in_RSI + 0x10));
  return;
}

Assistant:

QRenderRule() : features(0), hasFont(false), pal(nullptr), b(nullptr), bg(nullptr), bd(nullptr), ou(nullptr), geo(nullptr), p(nullptr), img(nullptr), clipset(0) { }